

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.cpp
# Opt level: O2

void helics::addTags(json *v,BasicHandleInfo *bhi)

{
  value_t vVar1;
  json_value jVar2;
  pointer ppVar3;
  reference pvVar4;
  long lVar5;
  ulong uVar6;
  initializer_list_t init;
  initializer_list_t init_00;
  json tagBlock;
  data local_78;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_68;
  data local_60;
  data local_50;
  data local_40;
  
  if ((bhi->tags).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (bhi->tags).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    init._M_len = 0;
    init._M_array = (iterator)&local_50;
    local_68 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)v;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::array(init);
    pvVar4 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(local_68,"tags");
    vVar1 = (pvVar4->m_data).m_type;
    (pvVar4->m_data).m_type = local_50.m_type;
    jVar2 = (pvVar4->m_data).m_value;
    (pvVar4->m_data).m_value = local_50.m_value;
    local_50.m_type = vVar1;
    local_50.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_50);
    lVar5 = 0;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)(bhi->tags).
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(bhi->tags).
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 6); uVar6 = uVar6 + 1) {
      init_00._M_len = 0;
      init_00._M_array = (iterator)&local_40;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::object(init_00);
      ppVar3 = (bhi->tags).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(ppVar3->first)._M_dataplus._M_p + lVar5));
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_40,"name");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_78.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_78.m_value;
      local_78.m_type = vVar1;
      local_78.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_78);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(ppVar3->second)._M_dataplus._M_p + lVar5));
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_40,"value");
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_60.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_60.m_value;
      local_60.m_type = vVar1;
      local_60.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_60);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(local_68,"tags");
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(pvVar4,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_40);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      lVar5 = lVar5 + 0x40;
    }
  }
  return;
}

Assistant:

static void addTags(nlohmann::json& v, const BasicHandleInfo& bhi)
{
    if (bhi.tagCount() > 0) {
        v["tags"] = nlohmann::json::array();
        for (size_t ii = 0; ii < bhi.tagCount(); ++ii) {
            nlohmann::json tagBlock = nlohmann::json::object();
            const auto& tg = bhi.getTagByIndex(ii);
            tagBlock["name"] = tg.first;
            tagBlock["value"] = tg.second;
            v["tags"].push_back(tagBlock);
        }
    }
}